

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O2

int KINSetResMonParams(void *kinmem,sunrealtype omegamin,sunrealtype omegamax)

{
  double dVar1;
  int line;
  int error_code;
  char *msgfmt;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    error_code = -1;
    kinmem = (KINMem)0x0;
    line = 0x20c;
  }
  else if (0.0 <= omegamin) {
    dVar1 = (double)(~-(ulong)(omegamin == 0.0) & (ulong)omegamin |
                    -(ulong)(omegamin == 0.0) & 0x3ee4f8b588e368f1);
    *(double *)((long)kinmem + 0x288) = dVar1;
    if (0.0 <= omegamax) {
      if ((omegamax != 0.0) || (NAN(omegamax))) {
        if (dVar1 <= omegamax) {
          *(sunrealtype *)((long)kinmem + 0x290) = omegamax;
          return 0;
        }
        msgfmt = "scalars < 0 illegal.";
        error_code = -2;
        line = 0x235;
      }
      else {
        if (dVar1 <= 0.9) {
          *(undefined8 *)((long)kinmem + 0x290) = 0x3feccccccccccccd;
          return 0;
        }
        msgfmt = "scalars < 0 illegal.";
        error_code = -2;
        line = 0x22b;
      }
    }
    else {
      msgfmt = "scalars < 0 illegal.";
      error_code = -2;
      line = 0x222;
    }
  }
  else {
    msgfmt = "scalars < 0 illegal.";
    error_code = -2;
    line = 0x216;
  }
  KINProcessError((KINMem)kinmem,error_code,line,"KINSetResMonParams",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int KINSetResMonParams(void* kinmem, sunrealtype omegamin, sunrealtype omegamax)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  /* check omegamin */

  if (omegamin < ZERO)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_OMEGA);
    return (KIN_ILL_INPUT);
  }

  if (omegamin == ZERO) { kin_mem->kin_omega_min = OMEGA_MIN; }
  else { kin_mem->kin_omega_min = omegamin; }

  /* check omegamax */

  if (omegamax < ZERO)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_OMEGA);
    return (KIN_ILL_INPUT);
  }

  if (omegamax == ZERO)
  {
    if (kin_mem->kin_omega_min > OMEGA_MAX)
    {
      KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_BAD_OMEGA);
      return (KIN_ILL_INPUT);
    }
    else { kin_mem->kin_omega_max = OMEGA_MAX; }
  }
  else
  {
    if (kin_mem->kin_omega_min > omegamax)
    {
      KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_BAD_OMEGA);
      return (KIN_ILL_INPUT);
    }
    else { kin_mem->kin_omega_max = omegamax; }
  }

  return (KIN_SUCCESS);
}